

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  bool bVar1;
  FileDescriptorProto *in_RDI;
  bool local_1;
  
  message_type(in_RDI);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
                    ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_RDI);
  if (bVar1) {
    enum_type(in_RDI);
    bVar1 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>>
                      ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_RDI);
    if (bVar1) {
      service(in_RDI);
      bVar1 = internal::
              AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>>
                        ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)in_RDI);
      if (bVar1) {
        extension(in_RDI);
        bVar1 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                          ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_RDI);
        if (bVar1) {
          bVar1 = has_options((FileDescriptorProto *)0x508cca);
          if ((!bVar1) || (bVar1 = FileOptions::IsInitialized((FileOptions *)in_RDI), bVar1)) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->message_type())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->service())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->extension())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}